

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5Dequote(char *z)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  
  cVar4 = ']';
  if (*z != '[') {
    cVar4 = *z;
  }
  cVar6 = z[1];
  if (cVar6 == '\0') {
    iVar1 = 1;
    uVar3 = 0;
  }
  else {
    uVar5 = 1;
    uVar3 = 0;
    do {
      uVar2 = (long)(int)uVar5 + 1;
      if (cVar6 == cVar4) {
        if (z[uVar2] != cVar4) goto LAB_001c72a7;
        uVar5 = uVar5 + 2;
        cVar6 = cVar4;
      }
      else {
        uVar5 = (uint)uVar2;
      }
      z[uVar3] = cVar6;
      uVar3 = uVar3 + 1;
      cVar6 = z[(int)uVar5];
    } while (cVar6 != '\0');
    uVar2 = (ulong)uVar5;
LAB_001c72a7:
    iVar1 = (int)uVar2;
    uVar3 = uVar3 & 0xffffffff;
  }
  z[uVar3] = '\0';
  return iVar1;
}

Assistant:

static int fts5Dequote(char *z){
  char q;
  int iIn = 1;
  int iOut = 0;
  q = z[0];

  /* Set stack variable q to the close-quote character */
  assert( q=='[' || q=='\'' || q=='"' || q=='`' );
  if( q=='[' ) q = ']';  

  while( ALWAYS(z[iIn]) ){
    if( z[iIn]==q ){
      if( z[iIn+1]!=q ){
        /* Character iIn was the close quote. */
        iIn++;
        break;
      }else{
        /* Character iIn and iIn+1 form an escaped quote character. Skip
        ** the input cursor past both and copy a single quote character 
        ** to the output buffer. */
        iIn += 2;
        z[iOut++] = q;
      }
    }else{
      z[iOut++] = z[iIn++];
    }
  }

  z[iOut] = '\0';
  return iIn;
}